

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

piece_index_t __thiscall
libtorrent::aux::torrent::get_piece_to_super_seed
          (torrent *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bits)

{
  pointer pppVar1;
  pointer pppVar2;
  peer_connection *this_00;
  int iVar3;
  bool bVar4;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar5;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar6;
  uint uVar7;
  ulong uVar8;
  pointer pppVar9;
  int iVar10;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar11;
  bool bVar12;
  bool bVar13;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  torrent *__range3;
  piece_index_t local_70;
  int local_6c;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_68;
  iterator iStack_60;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_58;
  ulong local_48;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_40;
  torrent *local_38;
  
  local_68 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
  iStack_60._M_current = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
  local_58 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
  local_38 = this;
  iVar5 = file_storage::piece_range
                    (&((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files);
  uVar8 = (ulong)iVar5 >> 0x20;
  if (iVar5._begin.m_val.m_val != iVar5._end.m_val.m_val) {
    local_6c = 9999;
    local_48 = uVar8;
    local_40 = bits;
    do {
      sVar11 = iVar5._begin.m_val;
      sVar6.m_val = sVar11.m_val + 0x1f;
      if (-1 < sVar11.m_val) {
        sVar6.m_val = sVar11.m_val;
      }
      uVar7 = 0x80000000 >> ((byte)iVar5._begin.m_val & 0x1f);
      local_70.m_val = sVar11.m_val;
      if ((*(uint *)((long)(bits->super_bitfield).m_buf.
                           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                     + 4 + (long)(sVar6.m_val >> 5) * 4) &
          (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)) == 0) {
        pppVar1 = (local_38->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pppVar2 = (local_38->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pppVar1 == pppVar2) {
          iVar10 = 0;
        }
        else {
          iVar10 = 0;
          do {
            pppVar9 = pppVar1 + 1;
            this_00 = *pppVar1;
            bVar12 = (this_00->m_superseed_piece)._M_elems[0].m_val != local_70.m_val;
            bVar13 = (this_00->m_superseed_piece)._M_elems[1].m_val != local_70.m_val;
            iVar3 = 999;
            if (bVar13 && bVar12) {
              bVar4 = peer_connection::has_piece(this_00,local_70);
              iVar3 = iVar10 + (uint)bVar4;
            }
            iVar10 = iVar3;
            pppVar1 = pppVar9;
          } while ((bVar13 && bVar12) && pppVar9 != pppVar2);
        }
        bits = local_40;
        uVar8 = local_48;
        if (iVar10 <= local_6c) {
          if (iVar10 == local_6c) {
            if (iStack_60._M_current == local_58) {
              ::std::
              vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
              ::
              _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                        ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                          *)&local_68,iStack_60,&local_70);
            }
            else {
              (iStack_60._M_current)->m_val = local_70.m_val;
LAB_00328793:
              iStack_60._M_current = iStack_60._M_current + 1;
            }
          }
          else {
            if (iStack_60._M_current != local_68) {
              iStack_60._M_current = local_68;
            }
            if (iStack_60._M_current != local_58) {
              (iStack_60._M_current)->m_val = local_70.m_val;
              local_6c = iVar10;
              goto LAB_00328793;
            }
            ::std::
            vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
            ::
            _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                      ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                        *)&local_68,iStack_60,&local_70);
            local_6c = iVar10;
          }
        }
      }
      iVar5._begin.m_val = sVar11.m_val + 1;
      iVar5._end.m_val = 0;
    } while (iVar5._begin.m_val != (uint)uVar8);
  }
  if (local_68 == iStack_60._M_current) {
    iVar10 = -1;
  }
  else {
    uVar8 = random((aux *)(ulong)((int)((ulong)((long)iStack_60._M_current - (long)local_68) >> 2) -
                                 1));
    iVar10 = local_68[uVar8 & 0xffffffff].m_val;
  }
  if (local_68 != (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return (piece_index_t)iVar10;
}

Assistant:

piece_index_t torrent::get_piece_to_super_seed(typed_bitfield<piece_index_t> const& bits)
	{
		// return a piece with low availability that is not in
		// the bitfield and that is not currently being super
		// seeded by any peer
		TORRENT_ASSERT(m_super_seeding);

		// do a linear search from the first piece
		int min_availability = 9999;
		std::vector<piece_index_t> avail_vec;
		for (auto const i : m_torrent_file->piece_range())
		{
			if (bits[i]) continue;

			int availability = 0;
			for (auto* pc : *this)
			{
				if (pc->super_seeded_piece(i))
				{
					// avoid super-seeding the same piece to more than one
					// peer if we can avoid it. Do this by artificially
					// increase the availability
					availability = 999;
					break;
				}
				if (pc->has_piece(i)) ++availability;
			}
			if (availability > min_availability) continue;
			if (availability == min_availability)
			{
				avail_vec.push_back(i);
				continue;
			}
			TORRENT_ASSERT(availability < min_availability);
			min_availability = availability;
			avail_vec.clear();
			avail_vec.push_back(i);
		}

		if (avail_vec.empty()) return piece_index_t{-1};
		return avail_vec[random(std::uint32_t(avail_vec.size() - 1))];
	}